

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall
wasm::WasmBinaryReader::WasmBinaryReader
          (WasmBinaryReader *this,Module *wasm,FeatureSet features,
          vector<char,_std::allocator<char>_> *input,vector<char,_std::allocator<char>_> *sourceMap)

{
  vector<char,_std::allocator<char>_> *sourceMap_local;
  vector<char,_std::allocator<char>_> *input_local;
  Module *wasm_local;
  WasmBinaryReader *this_local;
  FeatureSet features_local;
  
  this->wasm = wasm;
  this->allocator = &wasm->allocator;
  this->input = input;
  this->debugInfo = true;
  this->DWARF = false;
  this->skipFunctionBodies = false;
  this->pos = 0;
  this->startIndex = 0xffffffff;
  std::
  unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::unordered_set(&this->seenSections);
  IRBuilder::IRBuilder(&this->builder,wasm);
  SourceMapReader::SourceMapReader(&this->sourceMapReader,sourceMap);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&this->types);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&this->functionTypes);
  this->numFuncImports = 0;
  this->numFuncBodies = 0;
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&this->functionNames);
  std::
  unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>_>_>
  ::unordered_map(&this->localNames);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&this->typeNames);
  std::
  unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>_>_>
  ::unordered_map(&this->fieldNames);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&this->tableNames);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&this->memoryNames);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&this->globalNames);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&this->tagNames);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&this->dataNames);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map(&this->elemNames);
  this->currFunction = (Function *)0x0;
  this->endOfFunction = 0xffffffff;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&this->strings);
  this->dataCount = 0;
  this->hasDataCount = false;
  (wasm->features).features = features.features;
  return;
}

Assistant:

WasmBinaryReader::WasmBinaryReader(Module& wasm,
                                   FeatureSet features,
                                   const std::vector<char>& input,
                                   std::vector<char>& sourceMap)
  : wasm(wasm), allocator(wasm.allocator), input(input), builder(wasm),
    sourceMapReader(sourceMap) {
  wasm.features = features;
}